

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Serialize<HashedSourceWriter<DataStream>,char>
               (HashedSourceWriter<DataStream> *os,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  long lVar1;
  bool bVar2;
  size_t in_RCX;
  HashedSourceWriter<DataStream> *in_RDI;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  HashedSourceWriter<DataStream> *nSize;
  HashedSourceWriter<DataStream> *in_stack_ffffffffffffffd8;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nSize = in_RDI;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (in_stack_ffffffffffffffc8);
  WriteCompactSize<HashedSourceWriter<DataStream>>(in_stack_ffffffffffffffd8,(uint64_t)nSize);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (in_stack_ffffffffffffffc8);
  if (!bVar2) {
    SVar3 = MakeByteSpan<std::__cxx11::string_const&>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffffd8);
    local_20 = (void *)SVar3.m_size;
    HashedSourceWriter<DataStream>::write(in_RDI,(int)SVar3.m_data,local_20,in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::basic_string<C>& str)
{
    WriteCompactSize(os, str.size());
    if (!str.empty())
        os.write(MakeByteSpan(str));
}